

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int event_changelist_del_(event_base *base,int fd,short old,short events,void *p)

{
  byte bVar1;
  event_change *peVar2;
  uint8_t del;
  event_change *change;
  event_changelist_fdinfo *fdinfo;
  event_changelist *changelist;
  void *p_local;
  short events_local;
  short old_local;
  int fd_local;
  event_base *base_local;
  
  bVar1 = (byte)events & 0x20 | 2;
  peVar2 = event_changelist_get_or_construct(&base->changelist,fd,old,(event_changelist_fdinfo *)p);
  if (peVar2 == (event_change *)0x0) {
    base_local._4_4_ = -1;
  }
  else {
    if ((events & 10U) != 0) {
      if ((peVar2->old_events & 10U) == 0) {
        peVar2->read_change = '\0';
      }
      else {
        peVar2->read_change = bVar1;
      }
    }
    if ((events & 4U) != 0) {
      if ((peVar2->old_events & 4U) == 0) {
        peVar2->write_change = '\0';
      }
      else {
        peVar2->write_change = bVar1;
      }
    }
    if ((events & 0x80U) != 0) {
      if ((peVar2->old_events & 0x80U) == 0) {
        peVar2->close_change = '\0';
      }
      else {
        peVar2->close_change = bVar1;
      }
    }
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
event_changelist_del_(struct event_base *base, evutil_socket_t fd, short old, short events,
    void *p)
{
	struct event_changelist *changelist = &base->changelist;
	struct event_changelist_fdinfo *fdinfo = p;
	struct event_change *change;
	ev_uint8_t del = EV_CHANGE_DEL | (events & EV_ET);

	event_changelist_check(base);
	change = event_changelist_get_or_construct(changelist, fd, old, fdinfo);
	event_changelist_check(base);
	if (!change)
		return -1;

	/* A delete on an event set that doesn't contain the event to be
	   deleted produces a no-op.  This effectively emoves any previous
	   uncommitted add, rather than replacing it: on those platforms where
	   "add, delete, dispatch" is not the same as "no-op, dispatch", we
	   want the no-op behavior.

	   If we have a no-op item, we could remove it it from the list
	   entirely, but really there's not much point: skipping the no-op
	   change when we do the dispatch later is far cheaper than rejuggling
	   the array now.

	   As this stands, it also lets through deletions of events that are
	   not currently set.
	 */

	if (events & (EV_READ|EV_SIGNAL)) {
		if (!(change->old_events & (EV_READ | EV_SIGNAL)))
			change->read_change = 0;
		else
			change->read_change = del;
	}
	if (events & EV_WRITE) {
		if (!(change->old_events & EV_WRITE))
			change->write_change = 0;
		else
			change->write_change = del;
	}
	if (events & EV_CLOSED) {
		if (!(change->old_events & EV_CLOSED))
			change->close_change = 0;
		else
			change->close_change = del;
	}

	event_changelist_check(base);
	return (0);
}